

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

bool __thiscall leveldb::anon_unknown_3::DBIter::ParseKey(DBIter *this,ParsedInternalKey *ikey)

{
  Slice key;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  undefined4 extraout_var_00;
  size_t sVar4;
  char *extraout_RDX;
  Slice local_80;
  Slice local_70;
  Status local_60;
  size_t local_58;
  char *local_50;
  Slice local_48;
  ulong local_38;
  size_t bytes_read;
  Slice k;
  ParsedInternalKey *ikey_local;
  DBIter *this_local;
  
  k.size_ = (size_t)ikey;
  iVar2 = (*this->iter_->_vptr_Iterator[8])();
  bytes_read = CONCAT44(extraout_var,iVar2);
  k.data_ = extraout_RDX;
  sVar3 = Slice::size((Slice *)&bytes_read);
  iVar2 = (*this->iter_->_vptr_Iterator[9])();
  local_48.data_ = (char *)CONCAT44(extraout_var_00,iVar2);
  sVar4 = Slice::size(&local_48);
  local_38 = sVar3 + sVar4;
  while (this->bytes_until_read_sampling_ < local_38) {
    sVar3 = RandomCompactionPeriod(this);
    this->bytes_until_read_sampling_ = sVar3 + this->bytes_until_read_sampling_;
    local_58 = bytes_read;
    local_50 = k.data_;
    key.size_ = (size_t)k.data_;
    key.data_ = (char *)bytes_read;
    DBImpl::RecordReadSample(this->db_,key);
  }
  if (this->bytes_until_read_sampling_ < local_38) {
    __assert_fail("bytes_until_read_sampling_ >= bytes_read",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                  ,0x82,"bool leveldb::(anonymous namespace)::DBIter::ParseKey(ParsedInternalKey *)"
                 );
  }
  this->bytes_until_read_sampling_ = this->bytes_until_read_sampling_ - local_38;
  bVar1 = ParseInternalKey((Slice *)&bytes_read,(ParsedInternalKey *)k.size_);
  if (!bVar1) {
    Slice::Slice(&local_70,"corrupted internal key in DBIter");
    Slice::Slice(&local_80);
    Status::Corruption(&local_60,&local_70,&local_80);
    Status::operator=(&this->status_,&local_60);
    Status::~Status(&local_60);
  }
  return bVar1;
}

Assistant:

inline bool DBIter::ParseKey(ParsedInternalKey* ikey) {
  Slice k = iter_->key();

  size_t bytes_read = k.size() + iter_->value().size();
  while (bytes_until_read_sampling_ < bytes_read) {
    bytes_until_read_sampling_ += RandomCompactionPeriod();
    db_->RecordReadSample(k);
  }
  assert(bytes_until_read_sampling_ >= bytes_read);
  bytes_until_read_sampling_ -= bytes_read;

  if (!ParseInternalKey(k, ikey)) {
    status_ = Status::Corruption("corrupted internal key in DBIter");
    return false;
  } else {
    return true;
  }
}